

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar5;
  strbuf *out;
  char *__s1;
  char **ppcVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  BinarySource src [1];
  int local_70;
  char *local_60;
  BinarySource local_58;
  
  local_60 = (char *)0x0;
  bVar3 = true;
  local_70 = 0;
  pcVar5 = (char *)0x0;
  do {
    if (argc < 2) {
      __stream = _stdin;
      if ((pcVar5 == (char *)0x0) || (__stream = fopen(pcVar5,"r"), __stream != (FILE *)0x0)) {
        __stream_00 = _stdout;
        if ((local_60 == (char *)0x0) ||
           (__stream_00 = fopen(local_60,"w"), __stream_00 != (FILE *)0x0)) {
          values = newtree234(valuecmp);
          atexit(free_all_values);
          pcVar5 = fgetline((FILE *)__stream);
          for (pcVar5 = chomp(pcVar5); pcVar5 != (char *)0x0; pcVar5 = chomp(pcVar5)) {
            local_58.len = strlen(pcVar5);
            local_58.pos = 0;
            local_58.err = BSE_NO_ERROR;
            local_58.data = pcVar5;
            local_58.binarysource_ = &local_58;
            out = strbuf_new();
            process_line(&local_58,out);
            if (nfinalisers != 0) {
              lVar8 = 8;
              uVar9 = 0;
              do {
                (**(code **)((long)finalisers + lVar8 + -8))(out);
                uVar9 = uVar9 + 1;
                lVar8 = lVar8 + 0x10;
              } while (uVar9 < nfinalisers);
            }
            nfinalisers = 0;
            if (out->len == 0) {
              lVar8 = 0;
            }
            else {
              sVar7 = 0;
              lVar8 = 0;
              do {
                lVar8 = lVar8 + (ulong)(out->s[sVar7] == '\n');
                sVar7 = sVar7 + 1;
              } while (out->len != sVar7);
            }
            fprintf(__stream_00,"%zu\n%s",lVar8,out->s);
            fflush(__stream_00);
            strbuf_free(out);
            safefree(pcVar5);
            pcVar5 = fgetline((FILE *)__stream);
          }
          if (__stream != _stdin) {
            fclose(__stream);
          }
          if (__stream_00 != _stdin) {
            fclose(__stream_00);
          }
          return 0;
        }
        main_cold_2();
      }
      else {
        main_cold_1();
      }
      return 1;
    }
    iVar1 = argc + -1;
    ppcVar6 = argv + 1;
    __s1 = argv[1];
    if ((*__s1 == '-') && (bVar3)) {
      iVar4 = strcmp(__s1,"-o");
      if (iVar4 == 0) {
        if (argc == 2) {
          main_cold_4();
          local_70 = 1;
          bVar2 = false;
          argc = 0;
          __s1 = pcVar5;
        }
        else {
          argc = argc + -2;
          local_60 = argv[2];
          ppcVar6 = argv + 2;
          bVar2 = true;
          __s1 = pcVar5;
        }
      }
      else {
        iVar4 = strcmp(__s1,"--");
        if (iVar4 == 0) {
          bVar2 = true;
          bVar3 = false;
          __s1 = pcVar5;
          argc = iVar1;
        }
        else {
          iVar4 = strcmp(__s1,"--help");
          if (iVar4 == 0) {
            puts("usage: testcrypt [INFILE] [-o OUTFILE]");
            puts(" also: testcrypt --help       display this text");
            bVar2 = false;
            local_70 = 0;
            __s1 = pcVar5;
            argc = iVar1;
          }
          else {
            bVar2 = false;
            fprintf(_stderr,"unknown command line option \'%s\'\n",__s1);
            local_70 = 1;
            __s1 = pcVar5;
            argc = iVar1;
          }
        }
      }
    }
    else {
      bVar2 = true;
      argc = iVar1;
      if (pcVar5 != (char *)0x0) {
        main_cold_3();
        local_70 = 1;
        bVar2 = false;
        __s1 = pcVar5;
      }
    }
    pcVar5 = __s1;
    argv = ppcVar6;
  } while (bVar2);
  return local_70;
}

Assistant:

int main(int argc, char **argv)
{
    const char *infile = NULL, *outfile = NULL;
    bool doing_opts = true;

    while (--argc > 0) {
        char *p = *++argv;

        if (p[0] == '-' && doing_opts) {
            if (!strcmp(p, "-o")) {
                if (--argc <= 0) {
                    fprintf(stderr, "'-o' expects a filename\n");
                    return 1;
                }
                outfile = *++argv;
            } else if (!strcmp(p, "--")) {
                doing_opts = false;
            } else if (!strcmp(p, "--help")) {
                printf("usage: testcrypt [INFILE] [-o OUTFILE]\n");
                printf(" also: testcrypt --help       display this text\n");
                return 0;
            } else {
                fprintf(stderr, "unknown command line option '%s'\n", p);
                return 1;
            }
        } else if (!infile) {
            infile = p;
        } else {
            fprintf(stderr, "can only handle one input file name\n");
            return 1;
        }
    }

    FILE *infp = stdin;
    if (infile) {
        infp = fopen(infile, "r");
        if (!infp) {
            fprintf(stderr, "%s: open: %s\n", infile, strerror(errno));
            return 1;
        }
    }

    FILE *outfp = stdout;
    if (outfile) {
        outfp = fopen(outfile, "w");
        if (!outfp) {
            fprintf(stderr, "%s: open: %s\n", outfile, strerror(errno));
            return 1;
        }
    }

    values = newtree234(valuecmp);

    atexit(free_all_values);

    for (char *line; (line = chomp(fgetline(infp))) != NULL ;) {
        BinarySource src[1];
        BinarySource_BARE_INIT(src, line, strlen(line));
        strbuf *sb = strbuf_new();
        process_line(src, sb);
        run_finalisers(sb);
        size_t lines = 0;
        for (size_t i = 0; i < sb->len; i++)
            if (sb->s[i] == '\n')
                lines++;
        fprintf(outfp, "%"SIZEu"\n%s", lines, sb->s);
        fflush(outfp);
        strbuf_free(sb);
        sfree(line);
    }

    if (infp != stdin)
        fclose(infp);
    if (outfp != stdin)
        fclose(outfp);

    return 0;
}